

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O2

string * __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,MultiAgentDecisionProcessDiscreteFactoredStates *this)

{
  ostream *poVar1;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  MultiAgentDecisionProcess::SoftPrint_abi_cxx11_(&local_1c0,&this->super_MultiAgentDecisionProcess)
  ;
  std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  MADPComponentFactoredStates::SoftPrint_abi_cxx11_(&local_1c0,&this->_m_S);
  std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  MADPComponentDiscreteActions::SoftPrint_abi_cxx11_(&local_1c0,&this->_m_A);
  std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  MADPComponentDiscreteObservations::SoftPrint_abi_cxx11_(&local_1c0,&this->_m_O);
  std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  TwoStageDynamicBayesianNetwork::SoftPrint_abi_cxx11_(&local_1c0,&this->_m_2dbn);
  std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  if (this->_m_initialized == true) {
    poVar1 = std::operator<<(local_190,"Transition model: ");
    poVar1 = std::operator<<(poVar1,"(not yet implemented)");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(local_190,"Observation model: ");
    poVar1 = std::operator<<(poVar1,"(not yet implemented)");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string MultiAgentDecisionProcessDiscreteFactoredStates::SoftPrint() const
{
    stringstream ss;

    ss << MultiAgentDecisionProcess::SoftPrint();
    ss << _m_S.SoftPrint();
    ss << _m_A.SoftPrint();
    ss << _m_O.SoftPrint();   
    ss << _m_2dbn.SoftPrint();
    if(_m_initialized)
    {
        ss << "Transition model: " << 
            "(not yet implemented)"
            << endl;
        //ss << _m_p_tModel->SoftPrint();
        ss << "Observation model: " << 
            "(not yet implemented)"
            << endl;
        //ss << _m_p_oModel->SoftPrint();
    }
    return(ss.str());
}